

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_variable.cpp
# Opt level: O0

adios2_error adios2_variable_shapeid(adios2_shapeid *shapeid,adios2_variable *variable)

{
  adios2_shapeid aVar1;
  string *in_RSI;
  adios2_variable *in_RDI;
  VariableBase *variableBase;
  allocator local_79;
  string *in_stack_ffffffffffffff88;
  ShapeID in_stack_ffffffffffffff94;
  allocator local_39;
  string local_38 [32];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_38,"for const adios2_variable, in call to adios2_variable_shapeid",&local_39);
  adios2::helper::CheckForNullptr<adios2_variable_const>(in_RDI,in_RSI);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff88,"in call to adios2_variable_shapeid",&local_79);
  aVar1 = anon_unknown.dwarf_2ebd5::adios2_ToShapeID
                    (in_stack_ffffffffffffff94,in_stack_ffffffffffffff88);
  *(adios2_shapeid *)in_RDI = aVar1;
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  return adios2_error_none;
}

Assistant:

adios2_error adios2_variable_shapeid(adios2_shapeid *shapeid, const adios2_variable *variable)
{
    try
    {
        adios2::helper::CheckForNullptr(variable, "for const adios2_variable, in call to "
                                                  "adios2_variable_shapeid");
        const adios2::core::VariableBase *variableBase =
            reinterpret_cast<const adios2::core::VariableBase *>(variable);

        *shapeid = adios2_ToShapeID(variableBase->m_ShapeID, "in call to adios2_variable_shapeid");
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(
            adios2::helper::ExceptionToError("adios2_variable_shapeid"));
    }
}